

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

IBillboardSceneNode * __thiscall
irr::scene::CSceneManager::addBillboardSceneNode
          (CSceneManager *this,ISceneNode *parent,dimension2d<float> *size,vector3df *position,
          s32 id,SColor colorTop,SColor colorBottom)

{
  IBillboardSceneNode *pIVar1;
  CBillboardSceneNode *this_00;
  
  if (parent == (ISceneNode *)0x0) {
    parent = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
  }
  this_00 = (CBillboardSceneNode *)operator_new(0x130);
  CBillboardSceneNode::CBillboardSceneNode
            (this_00,parent,&this->super_ISceneManager,id,position,size,colorTop,colorBottom);
  pIVar1 = (IBillboardSceneNode *)
           ((long)&this_00->_vptr_CBillboardSceneNode + (long)this_00->_vptr_CBillboardSceneNode[-3]
           );
  IReferenceCounted::drop
            ((IReferenceCounted *)
             ((long)(pIVar1->super_ISceneNode).AbsoluteTransformation.M +
             *(long *)(*(long *)((long)&this_00->_vptr_CBillboardSceneNode +
                                (long)this_00->_vptr_CBillboardSceneNode[-3]) + -0x18) + -0x30));
  return pIVar1;
}

Assistant:

IBillboardSceneNode *CSceneManager::addBillboardSceneNode(ISceneNode *parent,
		const core::dimension2d<f32> &size, const core::vector3df &position, s32 id,
		video::SColor colorTop, video::SColor colorBottom)
{
	if (!parent)
		parent = this;

	IBillboardSceneNode *node = new CBillboardSceneNode(parent, this, id, position, size,
			colorTop, colorBottom);
	node->drop();

	return node;
}